

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SetTextEncoding(sqlite3 *db,u8 enc)

{
  HashElem *pHVar1;
  Vdbe *pVVar2;
  CollSeq *pCVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  
  uVar4 = CONCAT71(in_register_00000031,enc) & 0xffffffff;
  db->enc = (u8)uVar4;
  pHVar1 = findElementWithHash(&db->aCollSeq,"BINARY",(uint *)0x0);
  pCVar3 = (CollSeq *)((long)pHVar1->data + uVar4 * 0x28 + -0x28);
  if (pHVar1->data == (void *)0x0) {
    pCVar3 = (CollSeq *)0x0;
  }
  db->pDfltColl = pCVar3;
  for (pVVar2 = db->pVdbe; pVVar2 != (Vdbe *)0x0; pVVar2 = pVVar2->pVNext) {
    *(ushort *)&pVVar2->field_0xc8 = (ushort)*(undefined4 *)&pVVar2->field_0xc8 & 0xfffc | 2;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SetTextEncoding(sqlite3 *db, u8 enc){
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  db->enc = enc;
  /* EVIDENCE-OF: R-08308-17224 The default collating function for all
  ** strings is BINARY.
  */
  db->pDfltColl = sqlite3FindCollSeq(db, enc, sqlite3StrBINARY, 0);
  sqlite3ExpirePreparedStatements(db, 1);
}